

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::MergeReturnPass::CreatePhiNodesForInst
          (MergeReturnPass *this,BasicBlock *merge_block,Instruction *inst)

{
  _Rb_tree_color _Var1;
  IRContext *pIVar2;
  DefUseManager *pDVar3;
  CFG *this_00;
  iterator instr;
  pointer pOVar4;
  uint **ppuVar5;
  mapped_type pBVar6;
  spv_ext_inst_table psVar7;
  char cVar8;
  uint32_t uVar9;
  BasicBlock *pBVar10;
  mapped_type *pmVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  Instruction *pIVar12;
  mapped_type *ppBVar13;
  _Base_ptr p_Var14;
  Instruction *pIVar15;
  uint **ppuVar16;
  _Base_ptr p_Var17;
  Operand *operand;
  spv_opcode_table psVar18;
  pointer pOVar19;
  Operand *operand_1;
  FeatureManager *pFVar20;
  undefined8 uVar21;
  _Rb_tree_header *p_Var22;
  bool bVar23;
  uint32_t pred_id;
  uint32_t undef_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> phi_operands;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  users_to_update;
  DominatorAnalysis *dom_tree;
  vector<unsigned_int,_std::allocator<unsigned_int>_> preds;
  mapped_type local_100;
  _Any_data local_f8;
  iterator local_e8;
  iterator *local_e0;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_d8;
  uint32_t local_d0;
  uint32_t local_cc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_a8;
  Instruction *local_a0;
  spv_opcode_table local_98;
  spv_opcode_table psStack_90;
  spv_operand_table local_88;
  undefined1 local_80 [16];
  code *local_70;
  code *local_68;
  spv_ext_inst_table local_60;
  spv_opcode_table local_58;
  _Head_base<0UL,_spvtools::opt::Module_*,_false> local_50;
  _Any_data local_48;
  _Manager_type local_38;
  
  local_100 = merge_block;
  local_60 = (spv_ext_inst_table)
             IRContext::GetDominatorAnalysis
                       ((this->super_MemPass).super_Pass.context_,merge_block->function_);
  if (inst->has_result_id_ != true) {
    return;
  }
  uVar9 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
  if (uVar9 == 0) {
    return;
  }
  pBVar10 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,inst);
  local_98 = (spv_opcode_table)0x0;
  psStack_90 = (spv_opcode_table)0x0;
  local_88 = (spv_operand_table)0x0;
  pIVar2 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar2);
  }
  pDVar3 = (pIVar2->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_f8._8_8_ = (BasicBlock *)0x0;
  local_f8._M_unused._M_object = operator_new(0x28);
  ((IRContext *)local_f8._M_unused._0_8_)->syntax_context_ = (spv_context)&local_98;
  *(undefined1 **)&((IRContext *)local_f8._M_unused._0_8_)->grammar_ = local_80 + 0x20;
  (((IRContext *)local_f8._M_unused._0_8_)->grammar_).operandTable_ = (spv_operand_table)inst;
  (((IRContext *)local_f8._M_unused._0_8_)->grammar_).opcodeTable_ = (spv_opcode_table)pBVar10;
  (((IRContext *)local_f8._M_unused._0_8_)->grammar_).extInstTable_ = (spv_ext_inst_table)this;
  local_e0 = (iterator *)
             std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/merge_return_pass.cpp:281:9)>
             ::_M_invoke;
  local_e8.node_ =
       (Instruction *)
       std::
       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/merge_return_pass.cpp:281:9)>
       ::_M_manager;
  analysis::DefUseManager::ForEachUser
            (pDVar3,inst,(function<void_(spvtools::opt::Instruction_*)> *)&local_f8);
  if (local_e8.node_ != (Instruction *)0x0) {
    (*(code *)local_e8.node_)(&local_f8,&local_f8,3);
  }
  if (local_98 == psStack_90) goto LAB_005f5d44;
  uVar9 = 0;
  if (inst->has_type_id_ == true) {
    uVar9 = Instruction::GetSingleWordOperand(inst,0);
  }
  local_cc = MemPass::Type2Undef(&this->super_MemPass,uVar9);
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  pmVar11 = std::__detail::
            _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->new_edges_,&local_100);
  pIVar2 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar2);
  }
  this_00 = (pIVar2->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  pIVar12 = (local_100->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar9 = 0;
  if (pIVar12->has_result_id_ == true) {
    uVar9 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  __x = CFG::preds(this_00,uVar9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,__x);
  if (local_48._M_unused._M_object != (void *)local_48._8_8_) {
    p_Var22 = &(pmVar11->_M_t)._M_impl.super__Rb_tree_header;
    uVar21 = local_48._M_unused._0_8_;
    do {
      _Var1 = *(_Rb_tree_color *)uVar21;
      local_f8._0_4_ = _Var1;
      p_Var14 = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var17 = &p_Var22->_M_header;
      if (p_Var14 == (_Base_ptr)0x0) {
LAB_005f5a09:
        uVar9 = 0;
        if (inst->has_result_id_ == true) {
          uVar9 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
        }
        local_80._0_4_ = uVar9;
        if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)local_80);
        }
        else {
LAB_005f5a30:
          *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = uVar9;
          local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        do {
          bVar23 = p_Var14[1]._M_color < _Var1;
          if (!bVar23) {
            p_Var17 = p_Var14;
          }
          p_Var14 = (&p_Var14->_M_left)[bVar23];
        } while (p_Var14 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var17 == p_Var22) || (_Var1 < p_Var17[1]._M_color))
        goto LAB_005f5a09;
        uVar9 = local_cc;
        if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_005f5a30;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_cc);
      }
      if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)local_f8._M_pod_data);
      }
      else {
        *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = local_f8._0_4_;
        local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar21 = uVar21 + 4;
    } while (uVar21 != local_48._8_8_);
  }
  pIVar2 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar2);
  }
  pDVar3 = (pIVar2->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar9 = 0;
  if (inst->has_type_id_ == true) {
    uVar9 = Instruction::GetSingleWordOperand(inst,0);
  }
  pIVar12 = analysis::DefUseManager::GetDef(pDVar3,uVar9);
  if (pIVar12->opcode_ == OpTypePointer) {
    pIVar2 = (this->super_MemPass).super_Pass.context_;
    pFVar20 = (pIVar2->feature_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
              .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    if (pFVar20 == (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(pIVar2);
      pFVar20 = (pIVar2->feature_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    }
    bVar23 = EnumSet<spv::Capability>::contains(&pFVar20->capabilities_,CapabilityVariablePointers);
    uVar9 = (pIVar12->has_result_id_ & 1) + 1;
    if (pIVar12->has_type_id_ == false) {
      uVar9 = (uint)pIVar12->has_result_id_;
    }
    uVar9 = Instruction::GetSingleWordOperand(pIVar12,uVar9);
    if ((bVar23) && ((uVar9 & 0xfffffff7) == 4)) goto LAB_005f5b48;
    local_a8._M_head_impl = Instruction::Clone(inst,(this->super_MemPass).super_Pass.context_);
    uVar9 = Pass::TakeNextId((Pass *)this);
    if ((local_a8._M_head_impl)->has_result_id_ == false) {
      __assert_fail("has_result_id_",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
    }
    if (uVar9 == 0) {
      __assert_fail("res_id != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2cd,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
    }
    local_e0 = &local_e8;
    local_f8._M_unused._M_object = &PTR__SmallVector_00930a20;
    local_d8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_e8.node_._0_4_ = uVar9;
    local_f8._8_8_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)
               ((long)&((OperandData *)
                       (((((local_a8._M_head_impl)->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_start)->words).buffer + -4))->
                       _vptr_SmallVector +
               (ulong)((uint)(local_a8._M_head_impl)->has_type_id_ * 0x30)),
               (SmallVector<unsigned_int,_2UL> *)&local_f8);
    local_f8._M_unused._M_object = &PTR__SmallVector_00930a20;
    if (local_d8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_d8,local_d8._M_head_impl);
    }
    pIVar12 = (local_100->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if (pIVar12->opcode_ == OpPhi) {
      do {
        pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        pIVar15 = pIVar12;
        if ((pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
          pIVar15 = (Instruction *)0x0;
        }
      } while (pIVar15->opcode_ == OpPhi);
    }
    pIVar12 = Instruction::InsertBefore
                        (pIVar12,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                  *)&local_a8);
    pIVar2 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar2);
    }
    analysis::DefUseManager::AnalyzeInstDefUse
              ((pIVar2->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               pIVar12);
    pBVar6 = local_100;
    pIVar2 = (this->super_MemPass).super_Pass.context_;
    local_f8._M_unused._0_8_ = (undefined8)pIVar12;
    if ((pIVar2->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
      ppBVar13 = std::__detail::
                 _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&pIVar2->instr_to_block_,(key_type *)&local_f8);
      *ppBVar13 = pBVar6;
    }
    psVar7 = local_60;
    pBVar6 = local_100;
    local_80._8_8_ = (void *)0x0;
    local_80._0_8_ = operator_new(0x18);
    ((IntrusiveNodeBase<spvtools::opt::Instruction> *)&((Module *)local_80._0_8_)->header_)->
    _vptr_IntrusiveNodeBase = (_func_int **)psVar7;
    ((IntrusiveNodeBase<spvtools::opt::Instruction> *)&((Module *)local_80._0_8_)->header_)->
    next_node_ = (Instruction *)pBVar6;
    ((IntrusiveNodeBase<spvtools::opt::Instruction> *)&((Module *)local_80._0_8_)->header_)->
    previous_node_ = (Instruction *)this;
    local_68 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/merge_return_pass.cpp:358:28)>
               ::_M_invoke;
    local_70 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/merge_return_pass.cpp:358:28)>
               ::_M_manager;
    local_f8._8_8_ = (BasicBlock *)0x0;
    local_e0 = (iterator *)
               std::
               _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
               ::_M_invoke;
    local_e8.node_ =
         (Instruction *)
         std::
         _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
         ::_M_manager;
    pOVar19 = (pIVar12->operands_).
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pOVar4 = (pIVar12->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_f8._M_unused._M_object = (IRContext *)local_80;
    if (pOVar19 == pOVar4) {
LAB_005f5f60:
      (*(code *)local_e8.node_)(&local_f8,&local_f8,3);
    }
    else {
      do {
        bVar23 = spvIsInIdType(pOVar19->type);
        if (bVar23) {
          ppuVar5 = (uint **)(pOVar19->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar16 = &(pOVar19->words).small_data_;
          if (ppuVar5 != (uint **)0x0) {
            ppuVar16 = ppuVar5;
          }
          local_a0 = (Instruction *)*ppuVar16;
          if (local_e8.node_ == (Instruction *)0x0) {
LAB_005f5faa:
            std::__throw_bad_function_call();
          }
          cVar8 = (*(code *)local_e0)(&local_f8,&local_a0);
          if (cVar8 == '\0') break;
        }
        pOVar19 = pOVar19 + 1;
      } while (pOVar19 != pOVar4);
      if (local_e8.node_ != (Instruction *)0x0) goto LAB_005f5f60;
    }
    if (local_70 != (code *)0x0) {
      (*local_70)(local_80,local_80,3);
    }
    if (local_a8._M_head_impl != (Instruction *)0x0) {
      (*((local_a8._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
  }
  else {
LAB_005f5b48:
    pIVar2 = (this->super_MemPass).super_Pass.context_;
    instr.node_ = (local_100->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    local_f8._8_8_ = IRContext::get_instr_block(pIVar2,instr.node_);
    local_e0 = (iterator *)CONCAT44(local_e0._4_4_,3);
    uVar9 = 0;
    local_f8._M_unused._M_object = pIVar2;
    local_e8.node_ = instr.node_;
    if (inst->has_type_id_ == true) {
      uVar9 = Instruction::GetSingleWordOperand(inst,0);
    }
    pIVar12 = InstructionBuilder::AddPhi((InstructionBuilder *)&local_f8,uVar9,&local_c8,0);
  }
  local_d0 = 0;
  local_50._M_head_impl = (Module *)inst;
  if (pIVar12->has_result_id_ == true) {
    local_d0 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  local_58 = psStack_90;
  if (local_98 != psStack_90) {
    psVar18 = local_98;
    do {
      pIVar12 = *(Instruction **)psVar18;
      local_80._0_8_ = local_50._M_head_impl;
      local_80._12_4_ = 0;
      local_80._8_4_ = local_d0;
      local_68 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/merge_return_pass.cpp:375:25)>
                 ::_M_invoke;
      local_70 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/merge_return_pass.cpp:375:25)>
                 ::_M_manager;
      local_f8._8_8_ = (BasicBlock *)0x0;
      local_f8._M_unused._M_object = local_80;
      local_e0 = (iterator *)
                 std::
                 _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                 ::_M_invoke;
      local_e8.node_ =
           (Instruction *)
           std::
           _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
           ::_M_manager;
      pOVar19 = (pIVar12->operands_).
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pOVar4 = (pIVar12->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pOVar19 == pOVar4) {
LAB_005f5cbd:
        (*(code *)local_e8.node_)(&local_f8,&local_f8,3);
      }
      else {
        do {
          bVar23 = spvIsInIdType(pOVar19->type);
          if (bVar23) {
            ppuVar5 = (uint **)(pOVar19->words).large_data_._M_t.
                               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl;
            ppuVar16 = &(pOVar19->words).small_data_;
            if (ppuVar5 != (uint **)0x0) {
              ppuVar16 = ppuVar5;
            }
            local_a0 = (Instruction *)*ppuVar16;
            if (local_e8.node_ == (Instruction *)0x0) goto LAB_005f5faa;
            cVar8 = (*(code *)local_e0)(&local_f8,&local_a0);
            if (cVar8 == '\0') break;
          }
          pOVar19 = pOVar19 + 1;
        } while (pOVar19 != pOVar4);
        if (local_e8.node_ != (Instruction *)0x0) goto LAB_005f5cbd;
      }
      if (local_70 != (code *)0x0) {
        (*local_70)(local_80,local_80,3);
      }
      IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,pIVar12);
      psVar18 = (spv_opcode_table)&psVar18->entries;
    } while (psVar18 != local_58);
  }
  if ((_func_void *)local_48._M_unused._0_8_ != (_func_void *)0x0) {
    operator_delete(local_48._M_unused._M_object,(long)local_38 - local_48._0_8_);
  }
  if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_005f5d44:
  if (local_98 != (spv_opcode_table)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return;
}

Assistant:

void MergeReturnPass::CreatePhiNodesForInst(BasicBlock* merge_block,
                                            Instruction& inst) {
  DominatorAnalysis* dom_tree =
      context()->GetDominatorAnalysis(merge_block->GetParent());

  if (inst.result_id() != 0) {
    BasicBlock* inst_bb = context()->get_instr_block(&inst);
    std::vector<Instruction*> users_to_update;
    context()->get_def_use_mgr()->ForEachUser(
        &inst,
        [&users_to_update, &dom_tree, &inst, inst_bb, this](Instruction* user) {
          BasicBlock* user_bb = nullptr;
          if (user->opcode() != spv::Op::OpPhi) {
            user_bb = context()->get_instr_block(user);
          } else {
            // For OpPhi, the use should be considered to be in the predecessor.
            for (uint32_t i = 0; i < user->NumInOperands(); i += 2) {
              if (user->GetSingleWordInOperand(i) == inst.result_id()) {
                uint32_t user_bb_id = user->GetSingleWordInOperand(i + 1);
                user_bb = context()->get_instr_block(user_bb_id);
                break;
              }
            }
          }

          // If |user_bb| is nullptr, then |user| is not in the function.  It is
          // something like an OpName or decoration, which should not be
          // replaced with the result of the OpPhi.
          if (user_bb && !dom_tree->Dominates(inst_bb, user_bb)) {
            users_to_update.push_back(user);
          }
        });

    if (users_to_update.empty()) {
      return;
    }

    // There is at least one values that needs to be replaced.
    // First create the OpPhi instruction.
    uint32_t undef_id = Type2Undef(inst.type_id());
    std::vector<uint32_t> phi_operands;
    const std::set<uint32_t>& new_edges = new_edges_[merge_block];

    // Add the OpPhi operands. If the predecessor is a return block use undef,
    // otherwise use |inst|'s id.
    std::vector<uint32_t> preds = cfg()->preds(merge_block->id());
    for (uint32_t pred_id : preds) {
      if (new_edges.count(pred_id)) {
        phi_operands.push_back(undef_id);
      } else {
        phi_operands.push_back(inst.result_id());
      }
      phi_operands.push_back(pred_id);
    }

    Instruction* new_phi = nullptr;
    // If the instruction is a pointer and variable pointers are not an option,
    // then we have to regenerate the instruction instead of creating an OpPhi
    // instruction.  If not, the Spir-V will be invalid.
    Instruction* inst_type = get_def_use_mgr()->GetDef(inst.type_id());
    bool regenerateInstruction = false;
    if (inst_type->opcode() == spv::Op::OpTypePointer) {
      if (!context()->get_feature_mgr()->HasCapability(
              spv::Capability::VariablePointers)) {
        regenerateInstruction = true;
      }

      auto storage_class =
          spv::StorageClass(inst_type->GetSingleWordInOperand(0));
      if (storage_class != spv::StorageClass::Workgroup &&
          storage_class != spv::StorageClass::StorageBuffer) {
        regenerateInstruction = true;
      }
    }

    if (regenerateInstruction) {
      std::unique_ptr<Instruction> regen_inst(inst.Clone(context()));
      uint32_t new_id = TakeNextId();
      regen_inst->SetResultId(new_id);
      Instruction* insert_pos = &*merge_block->begin();
      while (insert_pos->opcode() == spv::Op::OpPhi) {
        insert_pos = insert_pos->NextNode();
      }
      new_phi = insert_pos->InsertBefore(std::move(regen_inst));
      get_def_use_mgr()->AnalyzeInstDefUse(new_phi);
      context()->set_instr_block(new_phi, merge_block);

      new_phi->ForEachInId([dom_tree, merge_block, this](uint32_t* use_id) {
        Instruction* use = get_def_use_mgr()->GetDef(*use_id);
        BasicBlock* use_bb = context()->get_instr_block(use);
        if (use_bb != nullptr && !dom_tree->Dominates(use_bb, merge_block)) {
          CreatePhiNodesForInst(merge_block, *use);
        }
      });
    } else {
      InstructionBuilder builder(
          context(), &*merge_block->begin(),
          IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
      new_phi = builder.AddPhi(inst.type_id(), phi_operands);
    }
    uint32_t result_of_phi = new_phi->result_id();

    // Update all of the users to use the result of the new OpPhi.
    for (Instruction* user : users_to_update) {
      user->ForEachInId([&inst, result_of_phi](uint32_t* id) {
        if (*id == inst.result_id()) {
          *id = result_of_phi;
        }
      });
      context()->AnalyzeUses(user);
    }
  }
}